

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

void declare_types(void)

{
  int iVar1;
  union_tag *puVar2;
  ushort **ppuVar3;
  bucket *pbVar4;
  union_tag *puVar5;
  char **ppcVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  undefined8 auStack_e0 [22];
  
  auStack_e0[0] = 0x113842;
  iVar1 = nextc();
  if (iVar1 == 0x3c) {
    auStack_e0[0] = 0x11384f;
    puVar2 = get_tag(1);
    auStack_e0[0] = 0x113857;
    iVar1 = nextc();
  }
  else {
    puVar2 = (union_tag *)0x0;
  }
  if (iVar1 == -1) {
    auStack_e0[0] = 0x113865;
    unexpected_EOF();
  }
LAB_00113868:
  auStack_e0[0] = 0x11386d;
  iVar1 = nextc();
  auStack_e0[0] = 0x113875;
  ppuVar3 = __ctype_b_loc();
  if (((*ppuVar3)[iVar1] >> 10 & 1) == 0) {
    uVar9 = iVar1 - 0x22;
    if (0x3d < uVar9) {
      return;
    }
    if ((0x2000000000001004U >> ((ulong)uVar9 & 0x3f) & 1) != 0) goto LAB_001138a7;
    if ((0x21UL >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
      return;
    }
    auStack_e0[0] = 0x1139b2;
    pbVar4 = get_literal();
    pbVar4->args = 0;
  }
  else {
LAB_001138a7:
    auStack_e0[0] = 0x1138ac;
    pbVar4 = get_name();
    auStack_e0[0] = 0x1138b4;
    iVar1 = nextc();
    if (iVar1 == 0x28) {
      if (-1 < pbVar4->args) {
        auStack_e0[0] = 0x1138cd;
        retyped_warning(pbVar4->name);
      }
      cptr = cptr + 1;
      lVar8 = 0;
      uVar9 = 8;
      lVar7 = 1;
      do {
        auStack_e0[0] = 0x1138e4;
        iVar1 = nextc();
        if (iVar1 != 0x3c) {
          if (iVar1 == -1) {
            auStack_e0[0] = 0x1138f3;
            unexpected_EOF();
          }
          auStack_e0[0] = 0x113910;
          syntax_error(input_file->lineno,line,cptr);
        }
        auStack_e0[0] = 0x113917;
        puVar5 = get_tag(1);
        auStack_e0[lVar7] = puVar5->name;
        auStack_e0[0] = 0x113925;
        iVar1 = nextc();
        if (iVar1 == -1) {
          auStack_e0[0] = 0x113936;
          unexpected_EOF();
        }
        else if (iVar1 == 0x29) goto LAB_00113949;
        lVar7 = lVar7 + 1;
        uVar9 = uVar9 + 8;
        lVar8 = lVar8 + 1;
      } while( true );
    }
    pbVar4->args = 0;
  }
  goto LAB_001139b9;
LAB_00113949:
  cptr = cptr + 1;
  pbVar4->args = (Yshort)lVar7;
  auStack_e0[0] = 0x11395c;
  ppcVar6 = (char **)allocate(uVar9);
  pbVar4->argnames = ppcVar6;
  if (ppcVar6 == (char **)0x0) {
    auStack_e0[0] = 0x11396a;
    no_space();
  }
  auStack_e0[0] = 0x113972;
  ppcVar6 = (char **)allocate(uVar9);
  pbVar4->argtags = ppcVar6;
  if (ppcVar6 == (char **)0x0) {
    auStack_e0[0] = 0x113980;
    no_space();
  }
  for (; 0 < (int)lVar8 + 1; lVar8 = lVar8 + -1) {
    pbVar4->argtags[lVar8] = (char *)auStack_e0[lVar8 + 1];
    pbVar4->argnames[lVar8] = (char *)0x0;
  }
LAB_001139b9:
  if (puVar2 != (union_tag *)0x0) {
    if (puVar2 != pbVar4->tag && pbVar4->tag != (union_tag *)0x0) {
      auStack_e0[0] = 0x1139df;
      retyped_warning(pbVar4->name);
    }
    pbVar4->tag = puVar2;
  }
  goto LAB_00113868;
}

Assistant:

void declare_types()
{
    register int c;
    register bucket *bp=0;
    union_tag *tag=0;

    c = nextc();
    if (c == '<') {
	tag = get_tag(1);
	c = nextc(); }
    if (c == EOF) unexpected_EOF();

    for (;;) {
	c = nextc();
	if (isalpha(c) || c == '_' || c == '.' || c == '$') {
	    bp = get_name();
	    if (nextc() == '(')
		declare_argtypes(bp);
	    else
		bp->args = 0; }
	else if (c == '\'' || c == '"') {
	    bp = get_literal();
	    bp->args = 0; }
	else
	    return;

	if (tag) {
	    if (bp->tag && tag != bp->tag)
		retyped_warning(bp->name);
	    bp->tag = tag; } }
}